

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openjpeg.c
# Opt level: O2

OPJ_BOOL opj_encoder_set_extra_options(opj_codec_t *p_codec,char **options)

{
  OPJ_BOOL OVar1;
  
  if ((p_codec != (opj_codec_t *)0x0) && (*(int *)(p_codec + 0x13) == 0)) {
    OVar1 = (*(code *)p_codec[6])(p_codec[0xc],options,p_codec + 0xd);
    return OVar1;
  }
  return 0;
}

Assistant:

OPJ_BOOL OPJ_CALLCONV opj_encoder_set_extra_options(opj_codec_t *p_codec,
        const char* const* options)
{
    if (p_codec) {
        opj_codec_private_t * l_codec = (opj_codec_private_t *) p_codec;

        if (! l_codec->is_decompressor) {
            return l_codec->m_codec_data.m_compression.opj_encoder_set_extra_options(
                       l_codec->m_codec,
                       options,
                       &(l_codec->m_event_mgr));
        }
    }

    return OPJ_FALSE;
}